

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     UnaryUpdateLoop<duckdb::QuantileState<short,duckdb::QuantileStandardType>,short,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
               (short *idata,AggregateInputData *aggr_input_data,
               QuantileState<short,_duckdb::QuantileStandardType> *state,idx_t count,
               ValidityMask *mask,SelectionVector *sel_vector)

{
  bool bVar1;
  QuantileState<short,_duckdb::QuantileStandardType> *in_RCX;
  AggregateInputData *in_RSI;
  TemplatedValidityMask<unsigned_long> *in_R8;
  SelectionVector *in_R9;
  idx_t i_1;
  idx_t i;
  AggregateUnaryInput input;
  short *in_stack_ffffffffffffffa8;
  QuantileState<short,_duckdb::QuantileStandardType> *pQVar2;
  QuantileState<short,_duckdb::QuantileStandardType> *in_stack_ffffffffffffffb0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffb8;
  
  AggregateUnaryInput::AggregateUnaryInput
            ((AggregateUnaryInput *)&stack0xffffffffffffffb8,in_RSI,(ValidityMask *)in_R8);
  bVar1 = QuantileOperation::IgnoreNull();
  if ((!bVar1) || (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid(in_R8), bVar1)) {
    for (pQVar2 = (QuantileState<short,_duckdb::QuantileStandardType> *)0x0; pQVar2 < in_RCX;
        pQVar2 = (QuantileState<short,_duckdb::QuantileStandardType> *)
                 ((long)&(pQVar2->v).super_vector<short,_std::allocator<short>_>.
                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)pQVar2);
      QuantileOperation::
      Operation<short,duckdb::QuantileState<short,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
                (in_stack_ffffffffffffffb0,(short *)pQVar2,(AggregateUnaryInput *)0xa0a125);
    }
  }
  else {
    for (pQVar2 = (QuantileState<short,_duckdb::QuantileStandardType> *)0x0; pQVar2 < in_RCX;
        pQVar2 = (QuantileState<short,_duckdb::QuantileStandardType> *)
                 ((long)&(pQVar2->v).super_vector<short,_std::allocator<short>_>.
                         super__Vector_base<short,_std::allocator<short>_>._M_impl.
                         super__Vector_impl_data._M_start + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)pQVar2);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (in_stack_ffffffffffffffb8,(idx_t)pQVar2);
      if (bVar1) {
        QuantileOperation::
        Operation<short,duckdb::QuantileState<short,duckdb::QuantileStandardType>,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>>
                  (pQVar2,in_stack_ffffffffffffffa8,(AggregateUnaryInput *)0xa0a0cc);
      }
    }
  }
  return;
}

Assistant:

static inline void UnaryUpdateLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                   STATE_TYPE *__restrict state, idx_t count, ValidityMask &mask,
	                                   const SelectionVector &__restrict sel_vector) {
		AggregateUnaryInput input(aggr_input_data, mask);
		if (OP::IgnoreNull() && !mask.AllValid()) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				if (mask.RowIsValid(input.input_idx)) {
					OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.input_idx = sel_vector.get_index(i);
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*state, idata[input.input_idx], input);
			}
		}
	}